

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmgen_opna.cpp
# Opt level: O3

void __thiscall FM::OPNABase::OPNABase(OPNABase *this)

{
  Chip *this_00;
  undefined1 *puVar1;
  undefined1 *puVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  double dVar6;
  
  (this->super_OPNBase).super_Timer._vptr_Timer = (_func_int **)&PTR___cxa_pure_virtual_00219f30;
  this_00 = &(this->super_OPNBase).chip;
  Chip::Chip(this_00);
  PSG::PSG(&(this->super_OPNBase).psg);
  (this->super_OPNBase).prescale = '\0';
  (this->super_OPNBase).super_Timer._vptr_Timer = (_func_int **)&PTR_SetStatus_00219fa8;
  lVar4 = 0x280;
  do {
    Channel4::Channel4((Channel4 *)((this->super_OPNBase).super_Timer.regta + lVar4 + -10));
    lVar4 = lVar4 + 0x2e0;
  } while (lVar4 != 0x13c0);
  this->adpcmbuf = (uint8 *)0x0;
  this->memaddr = 0;
  this->startaddr = 0;
  this->adpcmvol = 0;
  this->deltan = 0x100;
  this->control2 = '\0';
  if (tablehasmade == '\0') {
    iVar3 = -0x20;
    lVar4 = 0;
    do {
      dVar6 = exp2((double)iVar3 * -16.0 * 0.0078125);
      *(int *)((long)&tltable + lVar4) = (int)(long)(dVar6 * 65536.0) + -1;
      lVar4 = lVar4 + 4;
      iVar3 = iVar3 + 1;
    } while (lVar4 != 0x280);
    tablehasmade = '\x01';
  }
  BuildLFOTable();
  puVar1 = &this->field_0x2e0;
  puVar2 = &this->field_0x310;
  lVar4 = 0;
  do {
    *(Chip **)(this->adpcmreg + lVar4 * 0x2e0 + 0x67) = this_00;
    lVar5 = 0;
    do {
      *(Chip **)(puVar1 + lVar5) = this_00;
      lVar5 = lVar5 + 0xa0;
    } while (lVar5 != 0x280);
    lVar5 = 0;
    do {
      *(undefined4 *)(puVar2 + lVar5) = 0;
      lVar5 = lVar5 + 0xa0;
    } while (lVar5 != 0x280);
    lVar4 = lVar4 + 1;
    puVar1 = puVar1 + 0x2e0;
    puVar2 = puVar2 + 0x2e0;
  } while (lVar4 != 6);
  return;
}

Assistant:

OPNABase::OPNABase()
{
	adpcmbuf = 0;
	memaddr = 0;
	startaddr = 0;
	deltan = 256;

	adpcmvol = 0;
	control2 = 0;

	MakeTable2();
	BuildLFOTable();
	for (int i=0; i<6; i++)
	{
		ch[i].SetChip(&chip);
		ch[i].SetType(typeN);
	}
}